

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  undefined1 local_30 [12];
  uint uStack_24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    poVar1 = this->stream;
    local_30._0_8_ = this->colourImpl;
    local_30._8_4_ = FileName;
    uStack_24 = uStack_24 & 0xffffff00;
    ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_30,poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," for: ",6);
    if (uStack_24._0_1_ == true) {
      (**(code **)(*(size_type *)local_30._0_8_ + 0x10))(local_30._0_8_,0);
    }
    poVar1 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_30,this->result);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)local_30._0_8_,CONCAT44(uStack_24,local_30._8_4_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._0_8_ != &local_20) {
      operator_delete((void *)local_30._0_8_,local_20._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            stream << colourImpl->guardColour(compactDimColour) << " for: ";
            stream << result.getExpandedExpression();
        }
    }